

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O0

Orphan<capnp::DynamicValue> *
capnp::compiler::anon_unknown_0::makeExampleValue
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,Orphanage orphanage,uint ordinal,
          Type type,uint sharedOrdinalCount)

{
  Field FVar1;
  Enumerant enumerant;
  Orphanage orphanage_00;
  Orphanage orphanage_01;
  anon_union_8_2_eba6ea51_for_Type_5 aVar2;
  Which WVar3;
  uint uVar4;
  uint uVar5;
  NullableValue<capnp::StructSchema::Field> *other;
  Field *pFVar6;
  Orphan<capnp::DynamicStruct> *other_00;
  Orphan<capnp::DynamicList> *other_01;
  uint *params;
  DynamicEnum value;
  Type TVar7;
  Fault local_4a0;
  Fault f;
  Orphan<capnp::DynamicValue> local_478;
  Builder local_440;
  anon_union_8_2_eba6ea51_for_Type_5 local_408;
  undefined1 auStack_400 [16];
  Orphan<capnp::DynamicList> result_1;
  Type elementType;
  ListSchema listType;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  DynamicEnum local_368;
  Schema local_358;
  undefined1 local_350 [8];
  EnumerantList enumerants;
  Orphan<capnp::DynamicValue> local_2f0;
  Schema local_2b8;
  Schema SStack_2b0;
  uint local_2a8;
  undefined4 uStack_2a4;
  SegmentReader *pSStack_2a0;
  CapTableReader *local_298;
  void *pvStack_290;
  WirePointer *local_288;
  StructDataBitCount SStack_280;
  StructPointerCount SStack_27c;
  undefined2 uStack_27a;
  ArrayPtr<const_char> local_270;
  undefined1 auStack_260 [8];
  Field field;
  ArrayPtr<const_char> local_198;
  Maybe<capnp::StructSchema::Field> local_188;
  undefined1 local_140 [8];
  NullableValue<capnp::StructSchema::Field> fieldI;
  Builder builder;
  undefined1 local_c0 [8];
  Orphan<capnp::DynamicStruct> result;
  StructSchema structType;
  String local_80;
  ArrayPtr<const_char> local_68;
  Orphan<capnp::Text> local_58;
  uint local_34;
  undefined1 auStack_30 [4];
  uint ordinal_local;
  Type type_local;
  Orphanage orphanage_local;
  
  type_local._0_8_ = type.field_4;
  _auStack_30 = type._0_8_;
  type_local.field_4.scopeId = (uint64_t)orphanage.arena;
  local_34 = ordinal;
  WVar3 = capnp::Type::which((Type *)auStack_30);
  uVar4 = WVar3 - 1;
  if (uVar4 < 0xf || WVar3 == 0x10) {
    switch((long)&switchD_00208a1b::switchdataD_0031d03c +
           (long)(int)(&switchD_00208a1b::switchdataD_0031d03c)[uVar4]) {
    case 0x208a1d:
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,local_34 * 0xb8df);
      break;
    case 0x208a35:
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(double)local_34 * 313.25);
      break;
    case 0x208a5a:
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(local_34 & 0xff) - 0x80);
      break;
    case 0x208a7a:
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,local_34 * 0xd);
      break;
    case 0x208a8f:
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(local_34 & 1) == 0);
      break;
    case 0x208ab2:
      kj::str<unsigned_int&>(&local_80,(kj *)&local_34,params);
      Text::Reader::Reader((Reader *)&local_68,&local_80);
      Orphanage::newOrphanCopy<capnp::Text::Reader>
                (&local_58,(Orphanage *)&type_local.field_4,(Reader)local_68);
      Orphan<capnp::DynamicValue>::Orphan<capnp::Text>(__return_storage_ptr__,&local_58);
      Orphan<capnp::Text>::~Orphan(&local_58);
      kj::String::~String(&local_80);
      break;
    case 0x208b55:
      result.builder.location = (word *)capnp::Type::asStruct((Type *)auStack_30);
      Orphanage::newOrphan
                ((Orphan<capnp::DynamicStruct> *)local_c0,(Orphanage *)&type_local.field_4,
                 (StructSchema)result.builder.location);
      Orphan<capnp::DynamicStruct>::get
                ((Builder *)&fieldI.field_1.value.proto._reader.nestingLimit,
                 (Orphan<capnp::DynamicStruct> *)local_c0);
      kj::StringPtr::StringPtr((StringPtr *)&local_198,"i");
      StructSchema::findFieldByName
                (&local_188,(StructSchema *)&result.builder.location,(StringPtr)local_198);
      other = kj::_::readMaybe<capnp::StructSchema::Field>(&local_188);
      kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_140,other);
      kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_188);
      pFVar6 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_140);
      if (pFVar6 == (Field *)0x0) {
        kj::StringPtr::StringPtr((StringPtr *)&local_270,"f0");
        StructSchema::getFieldByName
                  ((Field *)auStack_260,(StructSchema *)&result.builder.location,
                   (StringPtr)local_270);
        aVar2 = type_local.field_4;
        uVar4 = local_34;
        local_288 = field.proto._reader.pointers;
        SStack_280 = field.proto._reader.dataSize;
        SStack_27c = field.proto._reader.pointerCount;
        uStack_27a = field.proto._reader._38_2_;
        local_298 = field.proto._reader.capTable;
        pvStack_290 = field.proto._reader.data;
        local_2a8 = field.index;
        uStack_2a4 = field._12_4_;
        pSStack_2a0 = field.proto._reader.segment;
        local_2b8.raw = (RawBrandedSchema *)auStack_260;
        SStack_2b0 = field.parent.super_Schema.raw;
        TVar7 = StructSchema::Field::getType((Field *)auStack_260);
        enumerants.list.reader._40_8_ = TVar7._0_8_;
        orphanage_01.capTable = orphanage.capTable;
        orphanage_01.arena = (BuilderArena *)aVar2.schema;
        makeExampleValue(&local_2f0,orphanage_01,uVar4,TVar7,sharedOrdinalCount);
        FVar1._8_8_ = SStack_2b0.raw;
        FVar1.parent.super_Schema.raw = (Schema)(Schema)local_2b8.raw;
        FVar1.proto._reader.segment = (SegmentReader *)_local_2a8;
        FVar1.proto._reader.capTable = (CapTableReader *)pSStack_2a0;
        FVar1.proto._reader.data = local_298;
        FVar1.proto._reader.pointers = (WirePointer *)pvStack_290;
        FVar1.proto._reader._32_8_ = local_288;
        FVar1.proto._reader.nestingLimit = SStack_280;
        FVar1.proto._reader._44_2_ = SStack_27c;
        FVar1.proto._reader._46_2_ = uStack_27a;
        DynamicStruct::Builder::adopt
                  ((Builder *)&fieldI.field_1.value.proto._reader.nestingLimit,FVar1,&local_2f0);
        Orphan<capnp::DynamicValue>::~Orphan(&local_2f0);
      }
      else {
        pFVar6 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                           ((NullableValue<capnp::StructSchema::Field> *)local_140);
        FVar1 = *pFVar6;
        DynamicValue::Reader::Reader((Reader *)&field.proto._reader.nestingLimit,local_34);
        DynamicStruct::Builder::set
                  ((Builder *)&fieldI.field_1.value.proto._reader.nestingLimit,FVar1,
                   (Reader *)&field.proto._reader.nestingLimit);
        DynamicValue::Reader::~Reader((Reader *)&field.proto._reader.nestingLimit);
      }
      kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_140);
      other_00 = kj::mv<capnp::Orphan<capnp::DynamicStruct>>
                           ((Orphan<capnp::DynamicStruct> *)local_c0);
      Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicStruct>(__return_storage_ptr__,other_00);
      Orphan<capnp::DynamicStruct>::~Orphan((Orphan<capnp::DynamicStruct> *)local_c0);
      break;
    case 0x208f11:
      local_358.raw = (RawBrandedSchema *)capnp::Type::asEnum((Type *)auStack_30);
      EnumSchema::getEnumerants((EnumerantList *)local_350,(EnumSchema *)&local_358);
      uVar4 = local_34;
      uVar5 = EnumSchema::EnumerantList::size((EnumerantList *)local_350);
      EnumSchema::EnumerantList::operator[]
                ((Enumerant *)&listType.elementType.field_4,(EnumerantList *)local_350,uVar4 % uVar5
                );
      enumerant._8_8_ = uStack_3a0;
      enumerant.parent.super_Schema.raw = (Schema)(Schema)listType.elementType.field_4.schema;
      enumerant.proto._reader.segment = (SegmentReader *)local_398;
      enumerant.proto._reader.capTable = (CapTableReader *)uStack_390;
      enumerant.proto._reader.data = (void *)local_388;
      enumerant.proto._reader.pointers = (WirePointer *)uStack_380;
      enumerant.proto._reader._32_8_ = local_378;
      enumerant.proto._reader._40_8_ = uStack_370;
      DynamicEnum::DynamicEnum(&local_368,enumerant);
      value._10_6_ = 0;
      value.schema.super_Schema.raw = local_368.schema.super_Schema.raw;
      value.value = local_368.value;
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,value);
      break;
    case 0x208fc1:
      join_0x00000010_0x00000000_ = (Type)capnp::Type::asList((Type *)auStack_30);
      join_0x00000010_0x00000000_ = ListSchema::getElementType((ListSchema *)&elementType.field_4);
      TVar7 = stack0xfffffffffffffc48;
      local_408 = elementType.field_4;
      auStack_400._0_2_ = listType.elementType.baseType;
      auStack_400[2] = listType.elementType.listDepth;
      auStack_400[3] = listType.elementType.isImplicitParam;
      auStack_400._4_2_ = listType.elementType.field_3;
      auStack_400._6_2_ = listType.elementType._6_2_;
      unique0x10001518 = TVar7;
      Orphanage::newOrphan
                ((Orphan<capnp::DynamicList> *)(auStack_400 + 8),(Orphanage *)&type_local.field_4,
                 (ListSchema)TVar7,1);
      Orphan<capnp::DynamicList>::get(&local_440,(Orphan<capnp::DynamicList> *)(auStack_400 + 8));
      f.exception = (Exception *)result_1.builder.location;
      orphanage_00.capTable = orphanage.capTable;
      orphanage_00.arena = (BuilderArena *)type_local.field_4.schema;
      makeExampleValue(&local_478,orphanage_00,local_34,stack0xfffffffffffffc38,sharedOrdinalCount);
      DynamicList::Builder::adopt(&local_440,0,&local_478);
      Orphan<capnp::DynamicValue>::~Orphan(&local_478);
      other_01 = kj::mv<capnp::Orphan<capnp::DynamicList>>
                           ((Orphan<capnp::DynamicList> *)(auStack_400 + 8));
      Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicList>(__return_storage_ptr__,other_01);
      Orphan<capnp::DynamicList>::~Orphan((Orphan<capnp::DynamicList> *)(auStack_400 + 8));
      break;
    default:
      goto switchD_00208a1b_caseD_209121;
    }
    return __return_storage_ptr__;
  }
switchD_00208a1b_caseD_209121:
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
            (&local_4a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
             ,0x1ff,FAILED,(char *)0x0,"\"You added a new possible field type!\"",
             (char (*) [37])"You added a new possible field type!");
  kj::_::Debug::Fault::fatal(&local_4a0);
}

Assistant:

Orphan<DynamicValue> makeExampleValue(
    Orphanage orphanage, uint ordinal, Type type, uint sharedOrdinalCount) {
  switch (type.which()) {
    case schema::Type::INT32: return ordinal * 47327;
    case schema::Type::FLOAT64: return ordinal * 313.25;
    case schema::Type::INT8: return int(ordinal % 256) - 128;
    case schema::Type::UINT16: return ordinal * 13;
    case schema::Type::BOOL: return ordinal % 2 == 0;
    case schema::Type::TEXT: return orphanage.newOrphanCopy(Text::Reader(kj::str(ordinal)));
    case schema::Type::STRUCT: {
      auto structType = type.asStruct();
      auto result = orphanage.newOrphan(structType);
      auto builder = result.get();

      KJ_IF_MAYBE(fieldI, structType.findFieldByName("i")) {
        // Type is "StructType"
        builder.set(*fieldI, ordinal);
      } else {
        // Type is "Int32Struct" or the like.
        auto field = structType.getFieldByName("f0");
        builder.adopt(field, makeExampleValue(
            orphanage, ordinal, field.getType(), sharedOrdinalCount));
      }

      return kj::mv(result);
    }
    case schema::Type::ENUM: {
      auto enumerants = type.asEnum().getEnumerants();
      return DynamicEnum(enumerants[ordinal %enumerants.size()]);
    }
    case schema::Type::LIST: {
      auto listType = type.asList();
      auto elementType = listType.getElementType();
      auto result = orphanage.newOrphan(listType, 1);
      result.get().adopt(0, makeExampleValue(
          orphanage, ordinal, elementType, sharedOrdinalCount));
      return kj::mv(result);
    }
    default:
      KJ_FAIL_ASSERT("You added a new possible field type!");
  }